

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,8,1,0,8,1>>::
resizeLike<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>,Eigen::Matrix<float,_1,1,0,_1,1>>>
          (PlainObjectBase<Eigen::Matrix<float,8,1,0,8,1>> *this,
          EigenBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
          *_other)

{
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  *other;
  
  PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_> *)this,8,1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }